

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxFRandom::Emit(FxFRandom *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  VMFunction *pVVar2;
  bool bVar3;
  uint uVar4;
  int opcode_00;
  FName local_34;
  int opcode;
  PSymbol *sym;
  VMFunction *callfunc;
  VMFunctionBuilder *build_local;
  FxFRandom *this_local;
  ExpEmit out;
  
  callfunc = (VMFunction *)build;
  build_local = (VMFunctionBuilder *)this;
  FName::FName(&local_34,NAME_BuiltinFRandom);
  _opcode = (DObject *)FindBuiltinFunction(&local_34,BuiltinFRandom);
  bVar3 = DObject::IsKindOf(_opcode,PSymbolVMFunction::RegistrationInfo.MyClass);
  pVVar2 = callfunc;
  if (!bVar3) {
    __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x1514,"virtual ExpEmit FxFRandom::Emit(VMFunctionBuilder *)");
  }
  if (_opcode[1]._vptr_DObject != (_func_int **)0x0) {
    sym = (PSymbol *)_opcode[1]._vptr_DObject;
    opcode_00 = 0x49;
    if (((this->super_FxRandom).EmitTail & 1U) != 0) {
      opcode_00 = 0x4c;
    }
    uVar4 = VMFunctionBuilder::GetConstantAddress
                      ((VMFunctionBuilder *)callfunc,(this->super_FxRandom).rng,'\x02');
    VMFunctionBuilder::Emit((VMFunctionBuilder *)pVVar2,0x46,0,7,uVar4);
    pVVar2 = callfunc;
    if (((this->super_FxRandom).min == (FxExpression *)0x0) ||
       ((this->super_FxRandom).max == (FxExpression *)0x0)) {
      uVar4 = VMFunctionBuilder::GetConstantAddress((VMFunctionBuilder *)callfunc,sym,'\x01');
      VMFunctionBuilder::Emit((VMFunctionBuilder *)pVVar2,opcode_00,uVar4,1,1);
    }
    else {
      EmitParameter((VMFunctionBuilder *)callfunc,(this->super_FxRandom).min,
                    &(this->super_FxRandom).super_FxExpression.ScriptPosition);
      EmitParameter((VMFunctionBuilder *)callfunc,(this->super_FxRandom).max,
                    &(this->super_FxRandom).super_FxExpression.ScriptPosition);
      pVVar2 = callfunc;
      uVar4 = VMFunctionBuilder::GetConstantAddress((VMFunctionBuilder *)callfunc,sym,'\x01');
      VMFunctionBuilder::Emit((VMFunctionBuilder *)pVVar2,opcode_00,uVar4,3,1);
    }
    if (((this->super_FxRandom).EmitTail & 1U) == 0) {
      ExpEmit::ExpEmit((ExpEmit *)&this_local,(VMFunctionBuilder *)callfunc,1,1);
      VMFunctionBuilder::Emit((VMFunctionBuilder *)callfunc,0x4d,0,1,(uint)(ushort)this_local);
    }
    else {
      ExpEmit::ExpEmit((ExpEmit *)&this_local);
      this_local._6_1_ = 1;
    }
    EVar1.RegType = this_local._2_1_;
    EVar1.RegCount = this_local._3_1_;
    EVar1.Konst = (bool)this_local._4_1_;
    EVar1.Fixed = (bool)this_local._5_1_;
    EVar1.RegNum = (ushort)this_local;
    EVar1.Final = (bool)this_local._6_1_;
    EVar1.Target = (bool)this_local._7_1_;
    return EVar1;
  }
  __assert_fail("((PSymbolVMFunction *)sym)->Function != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x1515,"virtual ExpEmit FxFRandom::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxFRandom::Emit(VMFunctionBuilder *build)
{
	// Call the BuiltinFRandom function to generate a floating point random number..
	VMFunction *callfunc;
	PSymbol *sym = FindBuiltinFunction(NAME_BuiltinFRandom, BuiltinFRandom);

	assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction)));
	assert(((PSymbolVMFunction *)sym)->Function != nullptr);
	callfunc = ((PSymbolVMFunction *)sym)->Function;

	int opcode = (EmitTail ? OP_TAIL_K : OP_CALL_K);

	build->Emit(OP_PARAM, 0, REGT_POINTER | REGT_KONST, build->GetConstantAddress(rng, ATAG_RNG));
	if (min != nullptr && max != nullptr)
	{
		EmitParameter(build, min, ScriptPosition);
		EmitParameter(build, max, ScriptPosition);
		build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 3, 1);
	}
	else
	{
		build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 1, 1);
	}

	if (EmitTail)
	{
		ExpEmit call;
		call.Final = true;
		return call;
	}

	ExpEmit out(build, REGT_FLOAT);
	build->Emit(OP_RESULT, 0, REGT_FLOAT, out.RegNum);
	return out;
}